

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_imply_from(REF_DBL *metric,REF_GRID ref_grid)

{
  double dVar1;
  double dVar2;
  REF_NODE ref_node;
  REF_CELL pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  size_t __size;
  REF_INT RVar9;
  int iVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  REF_DBL *pRVar15;
  long lVar16;
  REF_DBL *unaff_R15;
  double dVar17;
  double dVar18;
  uint local_194;
  double local_180;
  REF_INT nodes [27];
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_DBL log_m_1 [6];
  
  ref_node = ref_grid->node;
  iVar10 = ref_node->max;
  if ((long)iVar10 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x634,
           "ref_metric_imply_from","malloc total_node_volume of REF_DBL negative");
    __size = 1;
  }
  else {
    __size = (long)iVar10 * 8;
    unaff_R15 = (REF_DBL *)malloc(__size);
    if (unaff_R15 == (REF_DBL *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x634,"ref_metric_imply_from","malloc total_node_volume of REF_DBL NULL");
      __size = 2;
      unaff_R15 = (REF_DBL *)0x0;
    }
    else {
      bVar4 = true;
      if (iVar10 != 0) {
        memset(unaff_R15,0,__size);
      }
    }
  }
  local_194 = (uint)__size;
  if (bVar4) {
    if (0 < (long)ref_node->max) {
      memset(metric,0,(long)ref_node->max * 0x30);
    }
    if ((ref_grid->twod != 0) && (pRVar3 = ref_grid->cell[3], 0 < pRVar3->max)) {
      RVar9 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar3,RVar9,nodes);
        if (RVar5 == 0) {
          m[0]._0_4_ = nodes[0];
          m[0]._4_4_ = nodes[1];
          m[1]._0_4_ = nodes[2];
          pRVar15 = ref_node->real;
          RVar5 = ref_matrix_imply_m3(log_m,pRVar15 + (long)nodes[0] * 0xf,
                                      pRVar15 + (long)nodes[1] * 0xf,pRVar15 + (long)nodes[2] * 0xf)
          ;
          if (RVar5 == 0) {
            uVar6 = ref_matrix_log_m(log_m,log_m_1);
            if (uVar6 == 0) {
              uVar6 = ref_node_tri_area(ref_node,(REF_INT *)m,&local_180);
              if (uVar6 == 0) {
                iVar10 = pRVar3->node_per;
                if (0 < (long)iVar10) {
                  lVar16 = 0;
                  do {
                    lVar7 = (long)nodes[lVar16];
                    unaff_R15[lVar7] = unaff_R15[lVar7] + local_180;
                    lVar12 = 0;
                    do {
                      metric[lVar7 * 6 + lVar12] =
                           log_m_1[lVar12] * local_180 + metric[lVar7 * 6 + lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 6);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != iVar10);
                }
                goto LAB_001b176b;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x61e,"add_sub_tri",(ulong)uVar6,"area");
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x61d,"add_sub_tri",(ulong)uVar6,"log");
            }
          }
          else {
LAB_001b176b:
            uVar6 = 0;
          }
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x63e,"ref_metric_imply_from",(ulong)uVar6,"tet sub tet");
            return uVar6;
          }
        }
        RVar9 = RVar9 + 1;
      } while (RVar9 < pRVar3->max);
    }
    pRVar3 = ref_grid->cell[8];
    if (0 < pRVar3->max) {
      RVar9 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar3,RVar9,nodes);
        if ((RVar5 == 0) &&
           (uVar6 = add_sub_tet(0,1,2,3,nodes,metric,unaff_R15,ref_node,pRVar3), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x646,"ref_metric_imply_from",(ulong)uVar6,"tet sub tet");
          return uVar6;
        }
        RVar9 = RVar9 + 1;
      } while (RVar9 < pRVar3->max);
    }
    pRVar3 = ref_grid->cell[10];
    if (0 < pRVar3->max) {
      RVar9 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar3,RVar9,nodes);
        if (RVar5 == 0) {
          uVar6 = add_sub_tet(0,4,5,3,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x64d,"ref_metric_imply_from",(ulong)uVar6,"pri sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(0,1,5,4,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x650,"ref_metric_imply_from",(ulong)uVar6,"pri sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(0,1,2,5,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x653,"ref_metric_imply_from",(ulong)uVar6,"pri sub tet");
            return uVar6;
          }
        }
        RVar9 = RVar9 + 1;
      } while (RVar9 < pRVar3->max);
    }
    pRVar3 = ref_grid->cell[9];
    if (0 < pRVar3->max) {
      iVar10 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar3,iVar10,nodes);
        if (RVar5 == 0) {
          uVar6 = add_sub_tet(0,4,1,2,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x65a,"ref_metric_imply_from",(ulong)uVar6,"pyr sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(0,3,4,2,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x65d,"ref_metric_imply_from",(ulong)uVar6,"pyr sub tet");
            return uVar6;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < pRVar3->max);
    }
    pRVar3 = ref_grid->cell[0xb];
    if (0 < pRVar3->max) {
      RVar9 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar3,RVar9,nodes);
        if (RVar5 == 0) {
          uVar6 = add_sub_tet(0,5,7,4,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x664,"ref_metric_imply_from",(ulong)uVar6,"hex sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(0,1,7,5,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x667,"ref_metric_imply_from",(ulong)uVar6,"hex sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(1,6,7,5,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x66a,"ref_metric_imply_from",(ulong)uVar6,"hex sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(0,7,2,3,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x66e,"ref_metric_imply_from",(ulong)uVar6,"hex sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(0,7,1,2,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x671,"ref_metric_imply_from",(ulong)uVar6,"hex sub tet");
            return uVar6;
          }
          uVar6 = add_sub_tet(1,7,6,2,nodes,metric,unaff_R15,ref_node,pRVar3);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x674,"ref_metric_imply_from",(ulong)uVar6,"hex sub tet");
            return uVar6;
          }
        }
        RVar9 = RVar9 + 1;
      } while (RVar9 < pRVar3->max);
    }
    if (0 < ref_node->max) {
      lVar16 = 0;
      pRVar15 = metric;
      do {
        if ((-1 < ref_node->global[lVar16]) && (ref_node->ref_mpi->id == ref_node->part[lVar16])) {
          dVar1 = unaff_R15[lVar16];
          if (dVar1 <= 0.0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x679,"ref_metric_imply_from","zero metric contributions");
            return 1;
          }
          puVar11 = (undefined8 *)((lVar16 * 0x30 & 0x7fffffff0U) + (long)metric);
          dVar17 = dVar1 * 1e+20;
          if (dVar17 <= -dVar17) {
            dVar17 = -dVar17;
          }
          lVar7 = 0;
          do {
            dVar2 = pRVar15[lVar7];
            dVar18 = dVar2;
            if (dVar2 <= -dVar2) {
              dVar18 = -dVar2;
            }
            if (dVar17 <= dVar18) {
              pcVar14 = "zero volume";
              local_194 = 4;
              uVar8 = 0x67c;
              uVar13 = 4;
              goto LAB_001b20c1;
            }
            log_m[lVar7] = dVar2 / dVar1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 6);
          uVar6 = ref_matrix_exp_m(log_m,m);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x67f,"ref_metric_imply_from",(ulong)uVar6,"exp");
            return uVar6;
          }
          puVar11[4] = m[4];
          puVar11[5] = m[5];
          puVar11[2] = m[2];
          puVar11[3] = m[3];
          *puVar11 = CONCAT44(m[0]._4_4_,m[0]._0_4_);
          puVar11[1] = CONCAT44(m[1]._4_4_,m[1]._0_4_);
          unaff_R15[lVar16] = 0.0;
        }
        lVar16 = lVar16 + 1;
        pRVar15 = pRVar15 + 6;
      } while (lVar16 < ref_node->max);
    }
    if (unaff_R15 != (REF_DBL *)0x0) {
      free(unaff_R15);
    }
    local_194 = ref_node_ghost_dbl(ref_node,metric,6);
    if (local_194 == 0) {
      local_194 = 0;
    }
    else {
      pcVar14 = "update ghosts";
      uVar8 = 0x687;
      uVar13 = (ulong)local_194;
LAB_001b20c1:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar8,"ref_metric_imply_from",uVar13,pcVar14);
    }
  }
  return local_194;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_from(REF_DBL *metric, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL m[6], log_m[6];
  REF_DBL *total_node_volume;
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  for (node = 0; node < ref_node_max(ref_node); node++)
    for (im = 0; im < 6; im++) metric[im + 6 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(add_sub_tri(0, 1, 2, nodes, metric, total_node_volume, ref_node,
                      ref_cell),
          "tet sub tet");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 1, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "tet sub tet");
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RAS(0.0 < total_node_volume[node], "zero metric contributions");
      for (im = 0; im < 6; im++) {
        if (!ref_math_divisible(metric[im + 6 * node], total_node_volume[node]))
          RSS(REF_DIV_ZERO, "zero volume");
        log_m[im] = metric[im + 6 * node] / total_node_volume[node];
      }
      RSS(ref_matrix_exp_m(log_m, m), "exp");
      for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
      total_node_volume[node] = 0.0;
    }
  }

  ref_free(total_node_volume);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}